

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O1

Maybe<wchar_t> __thiscall rc::Seq<wchar_t>::next(Seq<wchar_t> *this)

{
  long *in_RSI;
  
  if ((undefined8 *)*in_RSI == (undefined8 *)0x0) {
    *(undefined1 *)
     ((long)&(this->m_impl)._M_t.
             super___uniq_ptr_impl<rc::Seq<wchar_t>::ISeqImpl,_std::default_delete<rc::Seq<wchar_t>::ISeqImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_rc::Seq<wchar_t>::ISeqImpl_*,_std::default_delete<rc::Seq<wchar_t>::ISeqImpl>_>
             .super__Head_base<0UL,_rc::Seq<wchar_t>::ISeqImpl_*,_false>._M_head_impl + 4) = 0;
  }
  else {
    (*(code *)**(undefined8 **)*in_RSI)(this);
  }
  return (Maybe<wchar_t>)this;
}

Assistant:

Maybe<T> Seq<T>::next() noexcept {
  try {
    return m_impl ? m_impl->next() : Nothing;
  } catch (...) {
    m_impl.reset();
    return Nothing;
  }
}